

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O3

void __thiscall JAMA::Eigenvalue<double>::tql2(Eigenvalue<double> *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double **ppdVar4;
  double *pdVar5;
  pointer pdVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int j;
  pointer pdVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar24;
  undefined1 auVar23 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double local_100;
  ulong local_f0;
  double local_68;
  
  iVar3 = this->n;
  uVar11 = (ulong)iVar3;
  pdVar17 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)uVar11 < 2) {
    pdVar17[uVar11 - 1] = 0.0;
    if (iVar3 != 1) {
      return;
    }
  }
  else {
    memmove(pdVar17,pdVar17 + 1,(ulong)(iVar3 - 1) << 3);
    pdVar17[uVar11 - 1] = 0.0;
  }
  pdVar6 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = 1;
  local_f0 = 2;
  local_100 = 0.0;
  dVar29 = 0.0;
  uVar15 = 0;
  do {
    dVar25 = pdVar6[uVar15];
    dVar20 = pdVar17[uVar15];
    dVar19 = ABS(dVar20) + ABS(dVar25);
    if (ABS(dVar20) + ABS(dVar25) <= dVar29) {
      dVar19 = dVar29;
    }
    dVar29 = dVar19;
    uVar10 = (uint)uVar11;
    lVar7 = (long)(int)uVar10;
    uVar12 = uVar15;
    uVar8 = uVar13;
    if ((int)uVar13 < (int)uVar10) {
      uVar8 = uVar10;
    }
    do {
      if (ABS(pdVar17[uVar12]) <= dVar29 * 2.220446049250313e-16) {
        uVar8 = (uint)uVar12;
        break;
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < lVar7);
    uVar9 = (ulong)uVar8;
    uVar12 = uVar15 + 1;
    if (uVar15 < uVar9) {
      do {
        dVar19 = (pdVar6[uVar12] - dVar25) / (dVar20 + dVar20);
        dVar20 = hypot(dVar19,1.0);
        pdVar6 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar17 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar19 = (double)((ulong)-dVar20 & -(ulong)(dVar19 < 0.0) |
                         ~-(ulong)(dVar19 < 0.0) & (ulong)dVar20) + dVar19;
        dVar20 = pdVar17[uVar15] / dVar19;
        pdVar6[uVar15] = dVar20;
        dVar19 = dVar19 * pdVar17[uVar15];
        pdVar6[uVar12] = dVar19;
        dVar25 = dVar25 - dVar20;
        uVar8 = this->n;
        if ((long)(uVar15 + 2) < (long)(int)uVar8) {
          uVar11 = local_f0;
          do {
            pdVar6[uVar11] = pdVar6[uVar11] - dVar25;
            uVar11 = uVar11 + 1;
          } while (uVar8 != uVar11);
        }
        local_100 = local_100 + dVar25;
        dVar20 = pdVar17[uVar12];
        dVar28 = pdVar6[uVar9];
        auVar23 = ZEXT816(0x3ff0000000000000) << 0x40;
        uVar11 = uVar9;
        dVar24 = 1.0;
        do {
          dVar26 = dVar24;
          dVar24 = auVar23._8_8_;
          uVar18 = uVar11 - 1;
          dVar27 = dVar24 * pdVar17[uVar11 - 1];
          auVar21._0_8_ = hypot(dVar28,pdVar17[uVar11 - 1]);
          local_68 = auVar23._0_8_;
          pdVar17 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar17[uVar11] = local_68 * auVar21._0_8_;
          auVar23._8_8_ = dVar28;
          auVar23._0_8_ = pdVar17[uVar11 - 1];
          auVar21._8_8_ = auVar21._0_8_;
          auVar23 = divpd(auVar23,auVar21);
          pdVar6 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar1 = pdVar6[uVar11 - 1];
          dVar22 = auVar23._0_8_;
          dVar25 = auVar23._8_8_;
          pdVar6[uVar11] = (dVar25 * dVar27 + dVar22 * dVar1) * dVar22 + dVar28 * dVar24;
          uVar8 = this->n;
          lVar7 = (long)(int)uVar8;
          if (0 < lVar7) {
            ppdVar4 = (this->V).data_;
            lVar14 = 0;
            do {
              pdVar5 = ppdVar4[lVar14];
              dVar28 = pdVar5[uVar11];
              dVar2 = pdVar5[uVar18 & 0xffffffff];
              pdVar5[uVar11] = dVar22 * dVar2 + dVar25 * dVar28;
              pdVar5[uVar18 & 0xffffffff] = dVar2 * dVar25 + dVar28 * -dVar22;
              lVar14 = lVar14 + 1;
            } while (lVar7 != lVar14);
          }
          dVar28 = dVar25 * dVar1 - dVar27 * dVar22;
          uVar11 = uVar18;
        } while ((long)uVar15 < (long)uVar18);
        dVar19 = (dVar20 * dVar26 * -dVar22 * local_68 * pdVar17[uVar15]) / dVar19;
        pdVar17[uVar15] = dVar22 * dVar19;
        dVar25 = dVar19 * dVar25;
        pdVar6[uVar15] = dVar25;
        dVar20 = pdVar17[uVar15];
      } while (dVar29 * 2.220446049250313e-16 < ABS(dVar20));
      uVar11 = (ulong)uVar8;
    }
    pdVar6[uVar15] = dVar25 + local_100;
    pdVar17[uVar15] = 0.0;
    uVar13 = uVar13 + 1;
    local_f0 = local_f0 + 1;
    uVar15 = uVar12;
    if (lVar7 <= (long)uVar12) {
      if (1 < (int)uVar11) {
        pdVar17 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppdVar4 = (this->V).data_;
        uVar12 = 1;
        uVar15 = 0;
        do {
          uVar16 = uVar15 + 1;
          uVar9 = uVar15 & 0xffffffff;
          uVar18 = uVar12;
          dVar29 = pdVar17[uVar15];
          do {
            if (pdVar17[uVar18] < dVar29) {
              uVar9 = uVar18 & 0xffffffff;
              dVar29 = pdVar17[uVar18];
            }
            uVar18 = uVar18 + 1;
          } while ((uVar11 & 0xffffffff) != uVar18);
          if (uVar15 != uVar9) {
            pdVar17[(int)uVar9] = pdVar17[uVar15];
            pdVar17[uVar15] = dVar29;
            uVar18 = 0;
            do {
              pdVar5 = ppdVar4[uVar18];
              dVar29 = pdVar5[uVar15];
              pdVar5[uVar15] = pdVar5[uVar9];
              pdVar5[uVar9] = dVar29;
              uVar18 = uVar18 + 1;
            } while ((uVar11 & 0xffffffff) != uVar18);
          }
          uVar12 = uVar12 + 1;
          uVar15 = uVar16;
        } while (uVar16 != (int)uVar11 - 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void tql2() {
      //  This is derived from the Algol procedures tql2, by
      //  Bowdler, Martin, Reinsch, and Wilkinson, Handbook for
      //  Auto. Comp., Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      for (int i = 1; i < n; i++) {
        e(i - 1) = e(i);
      }
      e(n - 1) = 0.0;

      Real f    = 0.0;
      Real tst1 = 0.0;
      Real eps  = pow(2.0, -52.0);
      for (int l = 0; l < n; l++) {
        // Find small subdiagonal element

        tst1  = max(tst1, abs(d(l)) + abs(e(l)));
        int m = l;

        // Original while-loop from Java code
        while (m < n) {
          if (abs(e(m)) <= eps * tst1) { break; }
          m++;
        }

        // If m == l, d(l) is an eigenvalue,
        // otherwise, iterate.

        if (m > l) {
          int iter = 0;
          do {
            iter = iter + 1;  // (Could check iteration count here.)

            // Compute implicit shift

            Real g = d(l);
            Real p = (d(l + 1) - g) / (2.0 * e(l));
            Real r = hypot(p, 1.0);
            if (p < 0) { r = -r; }
            d(l)     = e(l) / (p + r);
            d(l + 1) = e(l) * (p + r);
            Real dl1 = d(l + 1);
            Real h   = g - d(l);
            for (int i = l + 2; i < n; i++) {
              d(i) -= h;
            }
            f = f + h;

            // Implicit QL transformation.

            p        = d(m);
            Real c   = 1.0;
            Real c2  = c;
            Real c3  = c;
            Real el1 = e(l + 1);
            Real s   = 0.0;
            Real s2  = 0.0;
            for (int i = m - 1; i >= l; i--) {
              c3       = c2;
              c2       = c;
              s2       = s;
              g        = c * e(i);
              h        = c * p;
              r        = hypot(p, e(i));
              e(i + 1) = s * r;
              s        = e(i) / r;
              c        = p / r;
              p        = c * d(i) - s * g;
              d(i + 1) = h + s * (c * g + s * d(i));

              // Accumulate transformation.

              for (int k = 0; k < n; k++) {
                h           = V(k, i + 1);
                V(k, i + 1) = s * V(k, i) + c * h;
                V(k, i)     = c * V(k, i) - s * h;
              }
            }
            p    = -s * s2 * c3 * el1 * e(l) / dl1;
            e(l) = s * p;
            d(l) = c * p;

            // Check for convergence.

          } while (abs(e(l)) > eps * tst1);
        }
        d(l) = d(l) + f;
        e(l) = 0.0;
      }

      // Sort eigenvalues and corresponding vectors.

      for (int i = 0; i < n - 1; i++) {
        int k  = i;
        Real p = d(i);
        for (int j = i + 1; j < n; j++) {
          if (d(j) < p) {
            k = j;
            p = d(j);
          }
        }
        if (k != i) {
          d(k) = d(i);
          d(i) = p;
          for (int j = 0; j < n; j++) {
            p       = V(j, i);
            V(j, i) = V(j, k);
            V(j, k) = p;
          }
        }
      }
    }